

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

void __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::OnAllocFromNewSegment
          (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
           *this,uint pageCount,void *pages,
          SegmentBase<Memory::PreReservedVirtualAllocWrapper> *newSegment)

{
  size_t *psVar1;
  uint uVar2;
  ulong uVar3;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *list;
  
  uVar2 = this->maxAllocPageCount;
  uVar3 = (ulong)pageCount;
  this->usedBytes = this->usedBytes + uVar3 * 0x1000;
  LOCK();
  totalUsedBytes = totalUsedBytes + uVar3 * 0x1000;
  UNLOCK();
  if (maxUsedBytes < totalUsedBytes) {
    maxUsedBytes = totalUsedBytes;
  }
  if (this->memoryData != (PageMemoryData *)0x0) {
    psVar1 = &this->memoryData->allocPageCount;
    *psVar1 = *psVar1 + uVar3;
  }
  FillAllocPages(this,pages,pageCount);
  uVar3 = this->freePageCount - uVar3;
  this->freePageCount = uVar3;
  if (uVar3 < this->debugMinFreePageCount) {
    this->debugMinFreePageCount = uVar3;
  }
  list = &this->segments;
  if (uVar2 == pageCount) {
    list = &this->fullSegments;
  }
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::MoveHeadTo
            (&this->emptySegments,list);
  return;
}

Assistant:

void
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::OnAllocFromNewSegment(uint pageCount, __in void* pages, TSegment* newSegment)
{
    DListBase<TPageSegment>* targetSegmentList = (pageCount == maxAllocPageCount) ? &fullSegments : &segments;
    LogAllocPages(pageCount);

    this->FillAllocPages(pages, pageCount);
    this->freePageCount -= pageCount;
#if DBG
    UpdateMinimum(this->debugMinFreePageCount, this->freePageCount);
#endif

    Assert(targetSegmentList != nullptr);
    emptySegments.MoveHeadTo(targetSegmentList);
}